

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O3

sx__job_select_result sx__job_select(sx_job_context *ctx,uint32_t tid,uint32_t tags)

{
  sx_lock_t sVar1;
  uint32_t uVar2;
  sx__job *psVar3;
  sx__job *psVar4;
  uint uVar5;
  sx__job *psVar6;
  uint uVar7;
  undefined4 uVar8;
  sx_job_t puVar9;
  undefined8 uVar10;
  bool bVar11;
  sx__job_select_result sVar12;
  
  while( true ) {
    LOCK();
    sVar1 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  uVar10 = 0;
  uVar5 = 0;
  do {
    psVar6 = ctx->waiting_list[uVar5];
    if (psVar6 != (sx__job *)0x0) {
      do {
        puVar9 = psVar6->wait_counter;
        if (*puVar9 == 0) {
          uVar2 = psVar6->owner_tid;
          puVar9 = (sx_job_t)(ulong)CONCAT31((int3)(uVar2 >> 8),uVar2 != tid);
          if ((uVar2 == 0 || uVar2 == tid) &&
             ((psVar6->tags == 0 ||
              (uVar7 = psVar6->tags & tags, puVar9 = (sx_job_t)(ulong)uVar7, uVar7 != 0)))) {
            psVar3 = psVar6->next;
            psVar4 = psVar6->prev;
            if (psVar4 != (sx__job *)0x0) {
              psVar4->next = psVar3;
            }
            if (psVar3 != (sx__job *)0x0) {
              psVar3->prev = psVar4;
            }
            if (ctx->waiting_list[uVar5] == psVar6) {
              ctx->waiting_list[uVar5] = psVar3;
            }
            if (ctx->waiting_list_last[uVar5] == psVar6) {
              ctx->waiting_list_last[uVar5] = psVar6->prev;
            }
            psVar6->next = (sx__job *)0x0;
            psVar6->prev = (sx__job *)0x0;
            uVar8 = (undefined4)CONCAT71((int7)((ulong)&psVar6->next >> 8),1);
            goto LAB_0010beb1;
          }
        }
        psVar6 = psVar6->next;
      } while (psVar6 != (sx__job *)0x0);
      uVar10 = CONCAT71((int7)((ulong)puVar9 >> 8),1);
    }
    uVar8 = (undefined4)uVar10;
    bVar11 = 1 < uVar5;
    uVar5 = uVar5 + 1;
    if (bVar11) {
      psVar6 = (sx__job *)0x0;
LAB_0010beb1:
      ctx->job_lk = 0;
      sVar12._8_4_ = uVar8;
      sVar12.job = psVar6;
      sVar12._12_4_ = 0;
      return sVar12;
    }
  } while( true );
}

Assistant:

static sx__job_select_result sx__job_select(sx_job_context* ctx, uint32_t tid, uint32_t tags)
{
    sx__job_select_result r = { 0 };
    
    sx_lock(ctx->job_lk) {
        for (int pr = 0; pr < SX_JOB_PRIORITY_COUNT; pr++) {
            sx__job* node = ctx->waiting_list[pr];
            while (node) {
                r.waiting_list_alive = true;
                if (*node->wait_counter == 0) {    // job must not be waiting/depend on any jobs
                    if ((node->owner_tid == 0 || node->owner_tid == tid) &&
                        (node->tags == 0 || (node->tags & tags))) {
                        r.job = node;
                        sx__job_remove_list(&ctx->waiting_list[pr], &ctx->waiting_list_last[pr], node);
                        pr = SX_JOB_PRIORITY_COUNT; // break out of the outer loop
                        break;
                    }
                }
                node = node->next;
            }    // while(iterate nodes)
        }        // foreach(priority)
    } // lock

    return r;
}